

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

long anon_unknown.dwarf_66e92::roundtrip<long>(long *in)

{
  long out;
  long *in_stack_00000218;
  long *in_stack_00000220;
  undefined8 local_10;
  
  (anonymous_namespace)::roundtrip_into<long,long>(in_stack_00000220,in_stack_00000218);
  return local_10;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}